

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O2

void Eigen::internal::
     assign_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0,_0,_0>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *dst,
          CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          *src)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Index col;
  long lVar6;
  Index row;
  long lVar7;
  uint uVar8;
  
  lVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar3 = 0;
  lVar4 = 0;
  if (0 < lVar1) {
    lVar4 = lVar1;
  }
  lVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (lVar5 < 1) {
    lVar5 = lVar3;
  }
  for (lVar6 = 0; lVar6 != lVar5; lVar6 = lVar6 + 1) {
    pdVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    for (lVar7 = 0; lVar4 != lVar7; lVar7 = lVar7 + 1) {
      uVar8 = 0x3ff00000;
      if (lVar6 != lVar7) {
        uVar8 = 0;
      }
      *(ulong *)((long)pdVar2 + lVar7 * 8 + lVar3) = (ulong)uVar8 << 0x20;
    }
    lVar3 = lVar3 + lVar1 * 8;
  }
  return;
}

Assistant:

DenseIndex cols(void) const {return m_cols;}